

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

HTTPResponse * processHtml(HTTPResponse *__return_storage_ptr__,HTTPRequest *req)

{
  string local_88;
  string local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>
  local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"OK","");
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"text/html","");
  readFile(&local_48,&req->filepath);
  HTTPResponse::HTTPResponse(__return_storage_ptr__,200,&local_68,&local_88,&local_48.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.first._M_dataplus._M_p != &local_48.first.field_2) {
    operator_delete(local_48.first._M_dataplus._M_p,local_48.first.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

HTTPResponse processHtml(HTTPRequest &req)
{
    return HTTPResponse(200, "OK", "text/html", readFile(req.filepath).first);
}